

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.h
# Opt level: O3

void __thiscall uWS::Group<true>::~Group(Group<true> *this)

{
  std::_Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>::~_Deque_base
            ((_Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_> *)(this + 400));
  if (*(Group<true> **)(this + 0x158) != this + 0x168) {
    operator_delete(*(Group<true> **)(this + 0x158));
  }
  if (*(code **)(this + 0x130) != (code *)0x0) {
    (**(code **)(this + 0x130))(this + 0x120,this + 0x120,3);
  }
  if (*(code **)(this + 0x110) != (code *)0x0) {
    (**(code **)(this + 0x110))(this + 0x100,this + 0x100,3);
  }
  if (*(code **)(this + 0xf0) != (code *)0x0) {
    (**(code **)(this + 0xf0))(this + 0xe0,this + 0xe0,3);
  }
  if (*(code **)(this + 0xd0) != (code *)0x0) {
    (**(code **)(this + 0xd0))(this + 0xc0,this + 0xc0,3);
  }
  if (*(code **)(this + 0xb0) != (code *)0x0) {
    (**(code **)(this + 0xb0))(this + 0xa0,this + 0xa0,3);
  }
  if (*(code **)(this + 0x90) != (code *)0x0) {
    (**(code **)(this + 0x90))(this + 0x80,this + 0x80,3);
  }
  if (*(void **)(this + 0x68) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x68));
  }
  if (*(void **)(this + 0x50) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x50));
    return;
  }
  return;
}

Assistant:

struct WIN32_EXPORT Group : protected uS::NodeData {
    friend struct Hub;
    std::function<void(WebSocket<isServer>, UpgradeInfo)> connectionHandler;
    std::function<void(WebSocket<isServer>, char *message, size_t length, OpCode opCode)> messageHandler;
    std::function<void(WebSocket<isServer>, int code, char *message, size_t length)> disconnectionHandler;
    std::function<void(WebSocket<isServer>, char *, size_t)> pingHandler;
    std::function<void(WebSocket<isServer>, char *, size_t)> pongHandler;

    using errorType = typename std::conditional<isServer, int, void *>::type;
    std::function<void(errorType)> errorHandler;

    Hub *hub;
    int extensionOptions;
    uv_timer_t *timer = nullptr;
    std::string userPingMessage;

    // todo: cannot be named user, collides with parent!
    void *userData = nullptr;
    void setUserData(void *user);
    void *getUserData();
    void startAutoPing(int intervalMs, std::string userMessage = "");
    static void timerCallback(uv_timer_t *timer);

    uv_poll_t *webSocketHead = nullptr, *httpSocketHead = nullptr;
    void addWebSocket(uv_poll_t *webSocket);
    void removeWebSocket(uv_poll_t *webSocket);

    std::stack<uv_poll_t *> iterators;

protected:
    Group(int extensionOptions, Hub *hub, uS::NodeData *nodeData);
    void stopListening();

public:
    void onConnection(std::function<void(WebSocket<isServer>, UpgradeInfo ui)> handler);
    void onMessage(std::function<void(WebSocket<isServer>, char *, size_t, OpCode)> handler);
    void onDisconnection(std::function<void(WebSocket<isServer>, int code, char *message, size_t length)> handler);
    void onPing(std::function<void(WebSocket<isServer>, char *, size_t)> handler);
    void onPong(std::function<void(WebSocket<isServer>, char *, size_t)> handler);
    void onError(std::function<void(errorType)> handler);

    void broadcast(const char *message, size_t length, OpCode opCode);
    void terminate();
    void close(int code = 1000, char *message = nullptr, size_t length = 0);
    using NodeData::addAsync;

    // todo: handle nested forEachs with removeWebSocket
    template <class F>
    void forEach(const F &cb) {
        uv_poll_t *iterator = webSocketHead;
        iterators.push(iterator);
        while (iterator) {
            uv_poll_t *lastIterator = iterator;
            cb(WebSocket<isServer>(iterator));
            iterator = iterators.top();
            if (lastIterator == iterator) {
                iterator = ((uS::SocketData *) iterator->data)->next;
                iterators.top() = iterator;
            }
        }
        iterators.pop();
    }
}